

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_broker.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Creature *cr)

{
  int iVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[Creature ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(cr->name)._M_dataplus._M_p,(cr->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", attack = ",0xb);
  iVar1 = Creature::attack(cr);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", defense = ",0xc);
  iVar1 = Creature::defense(cr);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Creature& cr)
	{
		return out << "[Creature " << cr.name << ", attack = " << cr.attack() << ", defense = " << cr.defense() << "]";
	}